

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O1

unique_ptr<spvtools::opt::analysis::BoolConstant,_std::default_delete<spvtools::opt::analysis::BoolConstant>_>
 __thiscall
spvtools::
MakeUnique<spvtools::opt::analysis::BoolConstant,spvtools::opt::analysis::Bool_const*,bool_const&>
          (spvtools *this,Bool **args,bool *args_1)

{
  bool bVar1;
  Bool *pBVar2;
  undefined8 *puVar3;
  uint *puVar4;
  
  puVar3 = (undefined8 *)operator_new(0x30);
  pBVar2 = *args;
  bVar1 = *args_1;
  puVar4 = (uint *)operator_new(4);
  *puVar4 = (uint)bVar1;
  puVar3[1] = pBVar2;
  puVar3[2] = puVar4;
  puVar3[3] = puVar4 + 1;
  puVar3[4] = puVar4 + 1;
  *puVar3 = &PTR__ScalarConstant_003ef490;
  *(bool *)(puVar3 + 5) = bVar1;
  *(undefined8 **)this = puVar3;
  return (__uniq_ptr_data<spvtools::opt::analysis::BoolConstant,_std::default_delete<spvtools::opt::analysis::BoolConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::BoolConstant,_std::default_delete<spvtools::opt::analysis::BoolConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}